

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

int Cudd_AddHook(DdManager *dd,DD_HFP f,Cudd_HookType where)

{
  DdHook *pDVar1;
  int iVar2;
  DdHook **ppDVar3;
  
  iVar2 = 0;
  if (where < 4) {
    ppDVar3 = &dd->preGCHook + where;
    do {
      pDVar1 = *ppDVar3;
      if (pDVar1 == (DdHook *)0x0) {
        pDVar1 = (DdHook *)malloc(0x10);
        if (pDVar1 != (DdHook *)0x0) {
          pDVar1->next = (DdHook *)0x0;
          pDVar1->f = f;
          *ppDVar3 = pDVar1;
          return 1;
        }
        dd->errorCode = CUDD_MEMORY_OUT;
        return 0;
      }
      ppDVar3 = &pDVar1->next;
    } while (pDVar1->f != f);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int
Cudd_AddHook(
  DdManager * dd,
  DD_HFP f,
  Cudd_HookType where)
{
    DdHook **hook, *nextHook, *newHook;

    switch (where) {
    case CUDD_PRE_GC_HOOK:
        hook = &(dd->preGCHook);
        break;
    case CUDD_POST_GC_HOOK:
        hook = &(dd->postGCHook);
        break;
    case CUDD_PRE_REORDERING_HOOK:
        hook = &(dd->preReorderingHook);
        break;
    case CUDD_POST_REORDERING_HOOK:
        hook = &(dd->postReorderingHook);
        break;
    default:
        return(0);
    }
    /* Scan the list and find whether the function is already there.
    ** If so, just return. */
    nextHook = *hook;
    while (nextHook != NULL) {
        if (nextHook->f == f) {
            return(2);
        }
        hook = &(nextHook->next);
        nextHook = nextHook->next;
    }
    /* The function was not in the list. Create a new item and append it
    ** to the end of the list. */
    newHook = ABC_ALLOC(DdHook,1);
    if (newHook == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    newHook->next = NULL;
    newHook->f = f;
    *hook = newHook;
    return(1);

}